

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O2

void __thiscall NaDynAr<char_*>::print_contents(NaDynAr<char_*> *this)

{
  item *p;
  item *this_00;
  ulong uVar1;
  
  NaPrintLog("DynAr(this=0x%08p), %d items, contents:\n",this,(ulong)(uint)this->nItems);
  this_00 = this->pHead;
  if (this_00 != (item *)0x0) {
    uVar1 = 0;
    do {
      NaPrintLog("  [%d]\t",uVar1);
      item::print_self(this_00);
      this_00 = this_00->pNext;
      uVar1 = (ulong)((int)uVar1 + 1);
    } while (this_00 != (item *)0x0);
  }
  return;
}

Assistant:

virtual void  print_contents () const {
    int	i = 0;
    NaPrintLog("DynAr(this=0x%08p), %d items, contents:\n", this, nItems);
    if(NULL != pHead){
      item	*p = pHead;

      do{
	NaPrintLog("  [%d]\t", i++);
	p->print_self();
	p = p->pNext;
      }while(NULL != p);
    }
  }